

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_input_key(nk_context *ctx,nk_keys key,int down)

{
  uint *puVar1;
  
  if (ctx != (nk_context *)0x0) {
    puVar1 = &(ctx->input).keyboard.keys[key].clicked;
    *puVar1 = *puVar1 + 1;
    (ctx->input).keyboard.keys[key].down = down;
    return;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x36a9,"void nk_input_key(struct nk_context *, enum nk_keys, int)");
}

Assistant:

NK_API void
nk_input_key(struct nk_context *ctx, enum nk_keys key, int down)
{
    struct nk_input *in;
    NK_ASSERT(ctx);
    if (!ctx) return;
    in = &ctx->input;
#ifdef NK_KEYSTATE_BASED_INPUT
    if (in->keyboard.keys[key].down != down)
        in->keyboard.keys[key].clicked++;
#else
    in->keyboard.keys[key].clicked++;
#endif
    in->keyboard.keys[key].down = down;
}